

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O2

int tcp_dialer_get_locaddr(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  undefined1 local_b8 [8];
  nng_sockaddr sa;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  iVar1 = nni_posix_sockaddr2nn
                    ((nni_sockaddr *)local_b8,(void *)((long)arg + 0x20),
                     *(size_t *)((long)arg + 0xa0));
  if (iVar1 != 0) {
    local_b8._0_2_ = 0;
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_b8,buf,szp,t);
  return iVar1;
}

Assistant:

static int
tcp_dialer_get_locaddr(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_tcp_dialer *d = arg;
	nng_sockaddr    sa;

	nni_mtx_lock(&d->mtx);
	if (nni_posix_sockaddr2nn(&sa, &d->src, d->srclen) != 0) {
		sa.s_family = NNG_AF_UNSPEC;
	}
	nni_mtx_unlock(&d->mtx);
	return (nni_copyout_sockaddr(&sa, buf, szp, t));
}